

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Detail::Approx::setMargin(Approx *this,double margin)

{
  ReusableStringStream *pRVar1;
  char local_65 [13];
  ReusableStringStream local_58;
  string local_48;
  domain_error local_28 [16];
  double local_18;
  double margin_local;
  Approx *this_local;
  
  if (margin < 0.0) {
    local_18 = margin;
    margin_local = (double)this;
    ReusableStringStream::ReusableStringStream(&local_58);
    pRVar1 = ReusableStringStream::operator<<(&local_58,(char (*) [25])"Invalid Approx::margin: ");
    pRVar1 = ReusableStringStream::operator<<(pRVar1,&local_18);
    local_65[0] = '.';
    pRVar1 = ReusableStringStream::operator<<(pRVar1,local_65);
    pRVar1 = ReusableStringStream::operator<<
                       (pRVar1,(char (*) [40])" Approx::Margin has to be non-negative.");
    ReusableStringStream::str_abi_cxx11_(&local_48,pRVar1);
    std::domain_error::domain_error(local_28,(string *)&local_48);
    throw_exception<std::domain_error>(local_28);
  }
  this->m_margin = margin;
  return;
}

Assistant:

void Approx::setMargin(double margin) {
        CATCH_ENFORCE(margin >= 0,
            "Invalid Approx::margin: " << margin << '.'
            << " Approx::Margin has to be non-negative.");
        m_margin = margin;
    }